

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,784ul>,std::allocator<std::array<float,784ul>>>>>
::operator()(splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
             *this,value_type param_2,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *split,
            size_type *split_dim,scalar_type *split_val)

{
  anon_class_16_2_7d8a4650 __comp;
  anon_class_16_2_7d8a4650 __comp_00;
  anon_class_24_3_6927a40c __pred;
  bool bVar1;
  scalar_type *psVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  scalar_type *psVar5;
  splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
  *in_RCX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_R9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_00000008;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_00000010;
  anon_class_24_3_6927a40c comp;
  scalar_type max_delta;
  size_type in_stack_fffffffffffffef8;
  int iVar6;
  box<float,_784UL> *in_stack_ffffffffffffff00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *__lhs;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *this_00;
  scalar_type *in_stack_ffffffffffffff20;
  size_type *in_stack_ffffffffffffff28;
  box_base<pico_tree::internal::box<float,_784UL>_> *in_stack_ffffffffffffff30;
  size_type *in_stack_ffffffffffffff38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  scalar_type *in_stack_ffffffffffffff70;
  float local_34;
  
  box_base<pico_tree::internal::box<float,_784UL>_>::max_side
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  psVar2 = box<float,_784UL>::min(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  *(float *)&in_stack_00000010->_M_current = local_34 / 2.0 + *psVar2;
  __pred.split_dim = (size_type *)in_stack_ffffffffffffff68;
  __pred.this = (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
                 *)in_stack_ffffffffffffff60;
  __pred.split_val = in_stack_ffffffffffffff70;
  _Var4._M_current = in_RDI._M_current;
  __lhs = in_stack_00000008;
  this_00 = in_stack_00000010;
  _Var3 = ::std::operator()(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,__pred);
  in_R9->_M_current = _Var3._M_current;
  bVar1 = __gnu_cxx::operator==
                    (__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           _Var4._M_current);
  if (bVar1) {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator--
              (this_00,(int)((ulong)__lhs >> 0x20));
    iVar6 = (int)((ulong)_Var4._M_current >> 0x20);
    __comp.split_dim = in_stack_ffffffffffffff38;
    __comp.this = (splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
                   *)in_stack_ffffffffffffff30;
    ::std::operator()(in_RDI,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,__comp);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*(in_R9);
    psVar5 = space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
             ::operator[]<int>((space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
                                *)__lhs,iVar6);
    *(scalar_type *)&in_stack_00000010->_M_current = psVar5[(long)in_stack_00000008->_M_current];
  }
  else {
    bVar1 = __gnu_cxx::operator==
                      (__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             _Var4._M_current);
    iVar6 = (int)((ulong)_Var4._M_current >> 0x20);
    if (bVar1) {
      _Var4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(this_00,(int)((ulong)__lhs >> 0x20));
      __comp_00.split_dim = (size_type *)in_R9->_M_current;
      __comp_00.this = in_RCX;
      ::std::operator()(in_stack_ffffffffffffff50,_Var4,in_RDX,__comp_00);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*(in_R9)
      ;
      psVar5 = space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
               ::operator[]<int>((space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
                                  *)__lhs,iVar6);
      *(scalar_type *)&in_stack_00000010->_M_current = psVar5[(long)in_stack_00000008->_M_current];
    }
  }
  return;
}

Assistant:

inline void operator()(
      typename std::iterator_traits<
          RandomAccessIterator_>::value_type const,  // depth
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type const& box,
      RandomAccessIterator_& split,
      size_type& split_dim,
      scalar_type& split_val) const {
    scalar_type max_delta;
    box.max_side(split_dim, max_delta);
    split_val = max_delta / scalar_type(2.0) + box.min(split_dim);

    // Everything smaller than split_val goes left, the rest right.
    auto const comp = [this, &split_dim, &split_val](auto const index) -> bool {
      return space_[index][split_dim] < split_val;
    };

    split = std::partition(begin, end, comp);

    // If it happens that either all points are on the left side or right
    // side, one point slides to the other side and we split on the first
    // right value instead of the middle split. In these two cases the split
    // value is unknown and a partial sort is required to obtain it, but also
    // to rearrange all other indices such that they are on their
    // corresponding left or right side.
    if (split == end) {
      split--;
      std::nth_element(
          begin,
          split,
          end,
          [this, &split_dim](auto const index_a, auto const index_b) -> bool {
            return space_[index_a][split_dim] < space_[index_b][split_dim];
          });
      split_val = space_[*split][split_dim];
    } else if (split == begin) {
      split++;
      std::nth_element(
          begin,
          split,
          end,
          [this, &split_dim](auto const index_a, auto const index_b) -> bool {
            return space_[index_a][split_dim] < space_[index_b][split_dim];
          });
      split_val = space_[*split][split_dim];
    }
  }